

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall TTD::ThreadContextTTD::SyncRootsBeforeSnapshot_Record(ThreadContextTTD *this)

{
  ThreadContextTTD *this_local;
  
  CleanRecordWeakRootMap(this);
  JsUtil::
  BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::MapAndRemoveIf<TTD::ThreadContextTTD::SyncRootsBeforeSnapshot_Record()::__0>
            ((BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&this->m_ttdRootTagToObjectMap,(anon_class_8_1_8991fb9c)this);
  JsUtil::
  BaseDictionary<unsigned_long,bool,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::MapAndRemoveIf<TTD::ThreadContextTTD::SyncRootsBeforeSnapshot_Record()::__1>
            ((BaseDictionary<unsigned_long,bool,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&this->m_ttdMayBeLongLivedRoot,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void ThreadContextTTD::SyncRootsBeforeSnapshot_Record()
    {
        this->CleanRecordWeakRootMap();

        this->m_ttdRootTagToObjectMap.MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<TTD_LOG_PTR_ID, Js::RecyclableObject*>& entry) -> bool
        {
            return !this->m_ttdRecordRootWeakMap->Lookup(entry.Value(), false);
        });

        this->m_ttdMayBeLongLivedRoot.MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<TTD_LOG_PTR_ID, bool>& entry) -> bool
        {
            return !this->m_ttdRootTagToObjectMap.ContainsKey(entry.Key());
        });
    }